

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZDICT_printHex(void *ptr,size_t length)

{
  ulong in_RSI;
  long in_RDI;
  BYTE c;
  size_t u;
  BYTE *b;
  byte local_21;
  ulong local_20;
  
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    local_21 = *(byte *)(in_RDI + local_20);
    if ((local_21 < 0x20) || (0x7e < local_21)) {
      local_21 = 0x2e;
    }
    fprintf(_stderr,"%c",(ulong)local_21);
    fflush(_stderr);
  }
  return;
}

Assistant:

static void ZDICT_printHex(const void* ptr, size_t length)
{
    const BYTE* const b = (const BYTE*)ptr;
    size_t u;
    for (u=0; u<length; u++) {
        BYTE c = b[u];
        if (c<32 || c>126) c = '.';   /* non-printable char */
        DISPLAY("%c", c);
    }
}